

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_4bytes(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  uint *local_38;
  uint8_t *currentChar;
  uint *puStack_28;
  uint32_t one;
  uint32_t *current;
  uint32_t crc;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._0_4_ = previousCrc32 ^ 0xffffffff;
  puStack_28 = (uint *)data;
  for (_crc = length; 3 < _crc; _crc = _crc - 4) {
    uVar1 = *puStack_28 ^ (uint)current;
    current._0_4_ =
         Crc32Lookup[0][uVar1 >> 0x18] ^ Crc32Lookup[1][uVar1 >> 0x10 & 0xff] ^
         Crc32Lookup[2][uVar1 >> 8 & 0xff] ^ Crc32Lookup[3][uVar1 & 0xff];
    puStack_28 = puStack_28 + 1;
  }
  local_38 = puStack_28;
  while (_crc != 0) {
    current._0_4_ =
         (uint)current >> 8 ^ Crc32Lookup[0][(uint)current & 0xff ^ (uint)(byte)*local_38];
    local_38 = (uint *)((long)local_38 + 1);
    _crc = _crc - 1;
  }
  return (uint)current ^ 0xffffffff;
}

Assistant:

uint32_t crc32_4bytes(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t  crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // process four bytes at once (Slicing-by-4)
  while (length >= 4)
  {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one = *current++ ^ swap(crc);
    crc = Crc32Lookup[0][ one      & 0xFF] ^
          Crc32Lookup[1][(one>> 8) & 0xFF] ^
          Crc32Lookup[2][(one>>16) & 0xFF] ^
          Crc32Lookup[3][(one>>24) & 0xFF];
#else
    uint32_t one = *current++ ^ crc;
    crc = Crc32Lookup[0][(one>>24) & 0xFF] ^
          Crc32Lookup[1][(one>>16) & 0xFF] ^
          Crc32Lookup[2][(one>> 8) & 0xFF] ^
          Crc32Lookup[3][ one      & 0xFF];
#endif

    length -= 4;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 3 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}